

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.hpp
# Opt level: O2

void __thiscall helics::InterfaceInfo::~InterfaceInfo(InterfaceInfo *this)

{
  gmlc::containers::
  DualMappedPointerVector<helics::InputInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::~DualMappedPointerVector(&(this->inputs).m_obj);
  gmlc::containers::
  DualMappedPointerVector<helics::EndpointInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::~DualMappedPointerVector(&(this->endpoints).m_obj);
  gmlc::containers::
  DualMappedPointerVector<helics::PublicationInfo,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::InterfaceHandle>
  ::~DualMappedPointerVector(&(this->publications).m_obj);
  return;
}

Assistant:

InterfaceInfo() = default;